

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<PartialJPDPValuePair>
boost::dynamic_pointer_cast<PartialJPDPValuePair,PartialPolicyPoolItemInterface>
          (shared_ptr<PartialPolicyPoolItemInterface> *r)

{
  shared_ptr<PartialJPDPValuePair> *this;
  shared_ptr<PartialPolicyPoolItemInterface> *r_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  shared_ptr<PartialPolicyPoolItemInterface> *in_RSI;
  element_type *in_RDI;
  shared_ptr<PartialJPDPValuePair> sVar2;
  E *p;
  
  this = (shared_ptr<PartialJPDPValuePair> *)shared_ptr<PartialPolicyPoolItemInterface>::get(in_RSI)
  ;
  if (this == (shared_ptr<PartialJPDPValuePair> *)0x0) {
    r_00 = (shared_ptr<PartialPolicyPoolItemInterface> *)0x0;
  }
  else {
    r_00 = (shared_ptr<PartialPolicyPoolItemInterface> *)
           __dynamic_cast(this,&PartialPolicyPoolItemInterface::typeinfo,
                          &PartialJPDPValuePair::typeinfo,0);
  }
  if (r_00 == (shared_ptr<PartialPolicyPoolItemInterface> *)0x0) {
    shared_ptr<PartialJPDPValuePair>::shared_ptr((shared_ptr<PartialJPDPValuePair> *)0x97922f);
    sVar1.pi_ = extraout_RDX_00;
  }
  else {
    shared_ptr<PartialJPDPValuePair>::shared_ptr<PartialPolicyPoolItemInterface>
              (this,r_00,(element_type *)0x979223);
    sVar1.pi_ = extraout_RDX;
  }
  sVar2.pn.pi_ = sVar1.pi_;
  sVar2.px = in_RDI;
  return sVar2;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}